

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O3

int pkey_dh_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined4 *puVar1;
  
  puVar1 = (undefined4 *)OPENSSL_zalloc(4);
  if (puVar1 != (undefined4 *)0x0) {
    dst->data = puVar1;
    *puVar1 = *src->data;
  }
  return (uint)(puVar1 != (undefined4 *)0x0);
}

Assistant:

static int pkey_dh_copy(EVP_PKEY_CTX *dst, EVP_PKEY_CTX *src) {
  if (!pkey_dh_init(dst)) {
    return 0;
  }

  const DH_PKEY_CTX *sctx = reinterpret_cast<DH_PKEY_CTX *>(src->data);
  DH_PKEY_CTX *dctx = reinterpret_cast<DH_PKEY_CTX *>(dst->data);
  dctx->pad = sctx->pad;
  return 1;
}